

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O2

int kvtree_unset_kv(kvtree *hash,char *key,char *val)

{
  int iVar1;
  kvtree *hash_00;
  
  if (hash != (kvtree *)0x0) {
    hash_00 = kvtree_get(hash,key);
    kvtree_unset(hash_00,val);
    iVar1 = kvtree_size(hash_00);
    if (iVar1 == 0) {
      kvtree_unset(hash,key);
    }
  }
  return 0;
}

Assistant:

int kvtree_unset_kv(kvtree* hash, const char* key, const char* val)
{
  if (hash == NULL) {
    return KVTREE_SUCCESS;
  }

  kvtree* v = kvtree_get(hash, key);
  int rc = kvtree_unset(v, val);
  if (kvtree_size(v) == 0) {
    rc = kvtree_unset(hash, key);
  }

  return rc;
}